

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fBuiltinPrecisionTests.cpp
# Opt level: O0

TestCaseGroup * deqp::gles3::Functional::createBuiltinPrecisionTests(Context *context)

{
  TestCaseGroup *this;
  TestContext *testCtx;
  RenderContext *renderCtx;
  CaseFactories *cases;
  value_type local_58 [2];
  undefined1 local_50 [8];
  MovePtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactories,_de::DefaultDeleter<const_deqp::gls::BuiltinPrecisionTests::CaseFactories>_>
  es3Cases;
  vector<glu::ShaderType,_std::allocator<glu::ShaderType>_> shaderTypes;
  TestCaseGroup *group;
  Context *context_local;
  
  this = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(this,context,"precision","Builtin precision tests");
  std::vector<glu::ShaderType,_std::allocator<glu::ShaderType>_>::vector
            ((vector<glu::ShaderType,_std::allocator<glu::ShaderType>_> *)
             &es3Cases.
              super_UniqueBase<const_deqp::gls::BuiltinPrecisionTests::CaseFactories,_de::DefaultDeleter<const_deqp::gls::BuiltinPrecisionTests::CaseFactories>_>
              .m_data.field_0x8);
  deqp::gls::BuiltinPrecisionTests::createES3BuiltinCases();
  local_58[1] = 0;
  std::vector<glu::ShaderType,_std::allocator<glu::ShaderType>_>::push_back
            ((vector<glu::ShaderType,_std::allocator<glu::ShaderType>_> *)
             &es3Cases.
              super_UniqueBase<const_deqp::gls::BuiltinPrecisionTests::CaseFactories,_de::DefaultDeleter<const_deqp::gls::BuiltinPrecisionTests::CaseFactories>_>
              .m_data.field_0x8,local_58 + 1);
  local_58[0] = SHADERTYPE_FRAGMENT;
  std::vector<glu::ShaderType,_std::allocator<glu::ShaderType>_>::push_back
            ((vector<glu::ShaderType,_std::allocator<glu::ShaderType>_> *)
             &es3Cases.
              super_UniqueBase<const_deqp::gls::BuiltinPrecisionTests::CaseFactories,_de::DefaultDeleter<const_deqp::gls::BuiltinPrecisionTests::CaseFactories>_>
              .m_data.field_0x8,local_58);
  testCtx = gles3::Context::getTestContext(context);
  renderCtx = gles3::Context::getRenderContext(context);
  cases = de::details::
          UniqueBase<const_deqp::gls::BuiltinPrecisionTests::CaseFactories,_de::DefaultDeleter<const_deqp::gls::BuiltinPrecisionTests::CaseFactories>_>
          ::operator*((UniqueBase<const_deqp::gls::BuiltinPrecisionTests::CaseFactories,_de::DefaultDeleter<const_deqp::gls::BuiltinPrecisionTests::CaseFactories>_>
                       *)local_50);
  deqp::gls::BuiltinPrecisionTests::addBuiltinPrecisionTests
            (testCtx,renderCtx,cases,
             (vector<glu::ShaderType,_std::allocator<glu::ShaderType>_> *)
             &es3Cases.
              super_UniqueBase<const_deqp::gls::BuiltinPrecisionTests::CaseFactories,_de::DefaultDeleter<const_deqp::gls::BuiltinPrecisionTests::CaseFactories>_>
              .m_data.field_0x8,(TestCaseGroup *)this);
  de::details::
  MovePtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactories,_de::DefaultDeleter<const_deqp::gls::BuiltinPrecisionTests::CaseFactories>_>
  ::~MovePtr((MovePtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactories,_de::DefaultDeleter<const_deqp::gls::BuiltinPrecisionTests::CaseFactories>_>
              *)local_50);
  std::vector<glu::ShaderType,_std::allocator<glu::ShaderType>_>::~vector
            ((vector<glu::ShaderType,_std::allocator<glu::ShaderType>_> *)
             &es3Cases.
              super_UniqueBase<const_deqp::gls::BuiltinPrecisionTests::CaseFactories,_de::DefaultDeleter<const_deqp::gls::BuiltinPrecisionTests::CaseFactories>_>
              .m_data.field_0x8);
  return this;
}

Assistant:

TestCaseGroup* createBuiltinPrecisionTests (Context& context)
{
	TestCaseGroup*							group		= new TestCaseGroup(
		context, "precision", "Builtin precision tests");
	std::vector<glu::ShaderType>			shaderTypes;
	de::MovePtr<const bpt::CaseFactories>	es3Cases	= bpt::createES3BuiltinCases();

	shaderTypes.push_back(glu::SHADERTYPE_VERTEX);
	shaderTypes.push_back(glu::SHADERTYPE_FRAGMENT);

	bpt::addBuiltinPrecisionTests(context.getTestContext(),
								  context.getRenderContext(),
								  *es3Cases,
								  shaderTypes,
								  *group);
	return group;
}